

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O0

void beltMACStepA(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  belt_mac_st *st;
  void *in_stack_ffffffffffffffd8;
  ulong local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(ulong *)(in_RDX + 0x18) < 0x10) {
    if (in_RSI <= 0x10U - *(long *)(in_RDX + 0x18)) {
      memCopy(in_RDX,in_stack_ffffffffffffffd8,0x14bd76);
      *(ulong *)(in_RDX + 0x18) = in_RSI + *(long *)(in_RDX + 0x18);
      return;
    }
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x14bdb7);
    local_10 = in_RSI - (0x10 - *(long *)(in_RDX + 0x18));
    local_8 = (undefined8 *)((long)in_RDI + (0x10 - *(long *)(in_RDX + 0x18)));
    in_RDX[0x18] = 0x10;
    in_RDX[0x19] = 0;
  }
  for (; 0xf < local_10; local_10 = local_10 - 0x10) {
    *(ulong *)(in_RDX + 8) = *(ulong *)(in_RDX + 0x14) ^ *(ulong *)(in_RDX + 8);
    *(ulong *)(in_RDX + 10) = *(ulong *)(in_RDX + 0x16) ^ *(ulong *)(in_RDX + 10);
    beltBlockEncr2(in_RDX + 8,in_RDX);
    *(undefined8 *)(in_RDX + 0x14) = *local_8;
    *(undefined8 *)(in_RDX + 0x16) = local_8[1];
    local_8 = local_8 + 2;
  }
  if (local_10 != 0) {
    *(ulong *)(in_RDX + 8) = *(ulong *)(in_RDX + 0x14) ^ *(ulong *)(in_RDX + 8);
    *(ulong *)(in_RDX + 10) = *(ulong *)(in_RDX + 0x16) ^ *(ulong *)(in_RDX + 10);
    beltBlockEncr2(in_RDX + 8,in_RDX);
    memCopy(in_RDX,in_stack_ffffffffffffffd8,0x14beeb);
    *(ulong *)(in_RDX + 0x18) = local_10;
  }
  return;
}

Assistant:

void beltMACStepA(const void* buf, size_t count, void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltMAC_keep()));
	// накопить полный блок
	if (st->filled < 16)
	{
		if (count <= 16 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 16 - st->filled);
		count -= 16 - st->filled;
		buf = (const octet*)buf + 16 - st->filled;
		st->filled = 16;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor2(st->s, st->block);
		beltBlockEncr2(st->s, st->key);
		beltBlockCopy(st->block, buf);
		buf = (const octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor2(st->s, st->block);
		beltBlockEncr2(st->s, st->key);
		memCopy(st->block, buf, count);
		st->filled = count;
	}
}